

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O2

bool __thiscall
test_uintwide_t_n_binary_ops_template<96U,_unsigned_short,_void>::do_test
          (test_uintwide_t_n_binary_ops_template<96U,_unsigned_short,_void> *this,size_t rounds)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ostream *poVar8;
  size_t i;
  size_t sVar9;
  
  bVar7 = true;
  for (sVar9 = 0; rounds != sVar9; sVar9 = sVar9 + 1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "initialize()       boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[3])(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_add()  boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar1 = test_binary_add(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_sub()  boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar2 = test_binary_sub(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mul()  boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar3 = test_binary_mul(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_div()  boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar4 = test_binary_div(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mod()  boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar5 = test_binary_mod(this);
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "test_binary_sqrt() boost compare with uintwide_t: round ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar6 = test_binary_sqrt(this);
    bVar7 = (bool)((bVar6 && bVar5) & bVar7 & ((bVar4 && bVar3) && (bVar2 && bVar1)));
  }
  return bVar7;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_add()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_add() && result_is_ok);

        std::cout << "test_binary_sub()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sub() && result_is_ok);

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);

        std::cout << "test_binary_div()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_div() && result_is_ok);

        std::cout << "test_binary_mod()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mod() && result_is_ok);

        std::cout << "test_binary_sqrt() boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_sqrt() && result_is_ok);
      }

      return result_is_ok;
    }